

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3IndexedExprLookup(Parse *pParse,Expr *pExpr,int target)

{
  int iVar1;
  IndexedExpr *pIVar2;
  Vdbe *p;
  byte bVar3;
  int iVar4;
  int iTab;
  IndexedExpr **ppIVar5;
  long in_FS_OFFSET;
  Walker local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppIVar5 = &pParse->pIdxEpr;
  do {
    pIVar2 = *ppIVar5;
    iVar4 = -1;
    if (pIVar2 == (IndexedExpr *)0x0) {
LAB_00172933:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return iVar4;
    }
    iVar1 = pIVar2->iDataCur;
    if ((-1 < iVar1) &&
       (((iTab = iVar1, pParse->iSelfTab == 0 || (iTab = iVar4, iVar1 == pParse->iSelfTab + -1)) &&
        (iVar4 = sqlite3ExprCompare((Parse *)0x0,pExpr,pIVar2->pExpr,iTab), iVar4 == 0)))) {
      bVar3 = sqlite3ExprAffinity(pExpr);
      if (bVar3 < 0x42) {
        if (pIVar2->aff == 'A') goto LAB_001728ef;
      }
      else if (bVar3 == 0x42) {
        if (pIVar2->aff == 'B') {
LAB_001728ef:
          if ((int)pExpr->flags < 0) {
            local_68.walkerDepth = 0;
            local_68.eCode = 0;
            local_68.mWFlags = 0;
            local_68.u.pNC = (NameContext *)0x0;
            local_68.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
            local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
            local_68.xExprCallback = exprNodeCanReturnSubtype;
            local_68.pParse = pParse;
            sqlite3WalkExprNN(&local_68,pExpr);
            if (local_68.eCode != 0) goto LAB_00172927;
          }
          p = pParse->pVdbe;
          iVar4 = target;
          if (pIVar2->bMaybeNullRow == '\0') {
            sqlite3VdbeAddOp3(p,0x5e,pIVar2->iIdxCur,pIVar2->iIdxCol,target);
          }
          else {
            iVar1 = p->nOp;
            sqlite3VdbeAddOp3(p,0x14,pIVar2->iIdxCur,iVar1 + 3,target);
            sqlite3VdbeAddOp3(p,0x5e,pIVar2->iIdxCur,pIVar2->iIdxCol,target);
            sqlite3VdbeGoto(p,0);
            pIVar2 = pParse->pIdxEpr;
            pParse->pIdxEpr = (IndexedExpr *)0x0;
            sqlite3ExprCode(pParse,pExpr,target);
            pParse->pIdxEpr = pIVar2;
            sqlite3VdbeJumpHere(p,iVar1 + 2);
          }
          goto LAB_00172933;
        }
      }
      else if (pIVar2->aff == 'C') goto LAB_001728ef;
    }
LAB_00172927:
    ppIVar5 = &pIVar2->pIENext;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE int sqlite3IndexedExprLookup(
  Parse *pParse,   /* The parsing context */
  Expr *pExpr,     /* The expression to potentially bypass */
  int target       /* Where to store the result of the expression */
){
  IndexedExpr *p;
  Vdbe *v;
  for(p=pParse->pIdxEpr; p; p=p->pIENext){
    u8 exprAff;
    int iDataCur = p->iDataCur;
    if( iDataCur<0 ) continue;
    if( pParse->iSelfTab ){
      if( p->iDataCur!=pParse->iSelfTab-1 ) continue;
      iDataCur = -1;
    }
    if( sqlite3ExprCompare(0, pExpr, p->pExpr, iDataCur)!=0 ) continue;
    assert( p->aff>=SQLITE_AFF_BLOB && p->aff<=SQLITE_AFF_NUMERIC );
    exprAff = sqlite3ExprAffinity(pExpr);
    if( (exprAff<=SQLITE_AFF_BLOB && p->aff!=SQLITE_AFF_BLOB)
     || (exprAff==SQLITE_AFF_TEXT && p->aff!=SQLITE_AFF_TEXT)
     || (exprAff>=SQLITE_AFF_NUMERIC && p->aff!=SQLITE_AFF_NUMERIC)
    ){
      /* Affinity mismatch on a generated column */
      continue;
    }


    /* Functions that might set a subtype should not be replaced by the
    ** value taken from an expression index if they are themselves an
    ** argument to another scalar function or aggregate.
    ** https://sqlite.org/forum/forumpost/68d284c86b082c3e */
    if( ExprHasProperty(pExpr, EP_SubtArg)
     && sqlite3ExprCanReturnSubtype(pParse, pExpr)
    ){
      continue;
    }

    v = pParse->pVdbe;
    assert( v!=0 );
    if( p->bMaybeNullRow ){
      /* If the index is on a NULL row due to an outer join, then we
      ** cannot extract the value from the index.  The value must be
      ** computed using the original expression. */
      int addr = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_IfNullRow, p->iIdxCur, addr+3, target);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
      sqlite3VdbeGoto(v, 0);
      p = pParse->pIdxEpr;
      pParse->pIdxEpr = 0;
      sqlite3ExprCode(pParse, pExpr, target);
      pParse->pIdxEpr = p;
      sqlite3VdbeJumpHere(v, addr+2);
    }else{
      sqlite3VdbeAddOp3(v, OP_Column, p->iIdxCur, p->iIdxCol, target);
      VdbeComment((v, "%s expr-column %d", p->zIdxName, p->iIdxCol));
    }
    return target;
  }
  return -1;  /* Not found */
}